

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

void Curl_cpool_do_by_id(Curl_easy *data,curl_off_t conn_id,Curl_cpool_conn_do_cb *cb,void *cbdata)

{
  Curl_share *pCVar1;
  Curl_multi *pCVar2;
  cpool *cpool;
  cpool_do_conn_ctx dctx;
  curl_off_t local_28;
  Curl_cpool_conn_do_cb *local_20;
  void *local_18;
  
  if (data != (Curl_easy *)0x0) {
    pCVar1 = data->share;
    if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
      pCVar2 = data->multi_easy;
      if ((pCVar2 == (Curl_multi *)0x0) && (pCVar2 = data->multi, pCVar2 == (Curl_multi *)0x0)) {
        return;
      }
      cpool = &pCVar2->cpool;
    }
    else {
      cpool = &pCVar1->cpool;
    }
    local_28 = conn_id;
    local_20 = cb;
    local_18 = cbdata;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    cpool->field_0x98 = cpool->field_0x98 | 1;
    cpool_foreach(data,cpool,&local_28,cpool_do_conn);
    cpool->field_0x98 = cpool->field_0x98 & 0xfe;
    if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return;
}

Assistant:

void Curl_cpool_do_by_id(struct Curl_easy *data, curl_off_t conn_id,
                         Curl_cpool_conn_do_cb *cb, void *cbdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_do_conn_ctx dctx;

  if(!cpool)
    return;
  dctx.id = conn_id;
  dctx.cb = cb;
  dctx.cbdata = cbdata;
  CPOOL_LOCK(cpool);
  cpool_foreach(data, cpool, &dctx, cpool_do_conn);
  CPOOL_UNLOCK(cpool);
}